

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O3

void __thiscall
cfgfile::
tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
::on_finish(tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
            *this,parser_info_t<cfgfile::string_trait_t> *info)

{
  constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pcVar1;
  undefined8 *puVar2;
  tag_t<cfgfile::string_trait_t> *this_00;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  exception_t<cfgfile::string_trait_t> *peVar5;
  pos_t pos;
  pos_t pos_00;
  pos_t pos_01;
  undefined8 *puVar6;
  undefined1 *local_2d0;
  long local_2c8;
  undefined1 local_2c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  undefined1 *local_270;
  long local_268;
  undefined1 local_260 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 *local_1d0;
  long local_1c8;
  undefined1 local_1c0 [16];
  undefined1 *local_1b0;
  long local_1a8;
  undefined1 local_1a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string_t local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->super_tag_t<cfgfile::string_trait_t>).m_is_defined == false) {
    peVar5 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1f0,"Undefined value of tag: \"","");
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,local_1f0._M_dataplus._M_p,
               local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
    std::operator+(&local_150,&local_190,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
    local_2d0 = local_2c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"\". In file \"","");
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_210,local_2d0,local_2d0 + local_2c8);
    std::operator+(&local_130,&local_150,&local_210);
    std::operator+(&local_110,&local_130,&info->m_file_name);
    local_270 = local_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"\" on line ","");
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_250,local_270,local_270 + local_268);
    std::operator+(&local_f0,&local_110,&local_250);
    string_trait_t::to_string_abi_cxx11_(&local_230,(string_trait_t *)info->m_line_number,pos_00);
    std::operator+(&local_d0,&local_f0,&local_230);
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,".","");
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b0,local_290._M_dataplus._M_p,
               local_290._M_dataplus._M_p + local_290._M_string_length);
    std::operator+(&local_50,&local_d0,&local_2b0);
    exception_t<cfgfile::string_trait_t>::exception_t(peVar5,&local_50);
    __cxa_throw(peVar5,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  pcVar1 = this->m_constraint;
  if (pcVar1 != (constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    iVar4 = (*pcVar1->_vptr_constraint_t[2])(pcVar1,&this->m_value);
    if ((char)iVar4 == '\0') {
      peVar5 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
      local_2d0 = local_2c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"Invalid value: \"","");
      local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,local_2d0,local_2d0 + local_2c8);
      std::operator+(&local_1f0,&local_210,&this->m_value);
      local_270 = local_260;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_270,"\". Value must match to the constraint in tag \"","");
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,local_270,local_270 + local_268);
      std::operator+(&local_190,&local_1f0,&local_250);
      std::operator+(&local_150,&local_190,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"\". In file \"","");
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,local_2b0._M_dataplus._M_p,
                 local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
      std::operator+(&local_130,&local_150,&local_230);
      std::operator+(&local_110,&local_130,&info->m_file_name);
      local_1b0 = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"\" on line ","");
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_290,local_1b0,local_1b0 + local_1a8);
      std::operator+(&local_f0,&local_110,&local_290);
      string_trait_t::to_string_abi_cxx11_(&local_b0,(string_trait_t *)info->m_line_number,pos_01);
      std::operator+(&local_d0,&local_f0,&local_b0);
      local_1d0 = local_1c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,".","");
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,local_1d0,local_1d0 + local_1c8);
      std::operator+(&local_70,&local_d0,&local_170);
      exception_t<cfgfile::string_trait_t>::exception_t(peVar5,&local_70);
      __cxa_throw(peVar5,&exception_t<cfgfile::string_trait_t>::typeinfo,
                  exception_t<cfgfile::string_trait_t>::~exception_t);
    }
  }
  iVar4 = (*(this->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t[2])(this);
  puVar6 = *(undefined8 **)CONCAT44(extraout_var,iVar4);
  puVar2 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var,iVar4))[1];
  do {
    if (puVar6 == puVar2) {
      return;
    }
    this_00 = (tag_t<cfgfile::string_trait_t> *)*puVar6;
    if (this_00->m_is_mandatory == true) {
      bVar3 = tag_t<cfgfile::string_trait_t>::is_defined(this_00);
      if (!bVar3) {
        peVar5 = (exception_t<cfgfile::string_trait_t> *)__cxa_allocate_exception(0x30);
        local_2d0 = local_2c0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2d0,"Undefined child mandatory tag: \"","");
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_210,local_2d0,local_2d0 + local_2c8);
        std::operator+(&local_1f0,&local_210,&this_00->m_name);
        local_270 = local_260;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_270,"\". Where parent is: \"","");
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_250,local_270,local_270 + local_268);
        std::operator+(&local_190,&local_1f0,&local_250);
        std::operator+(&local_150,&local_190,&(this->super_tag_t<cfgfile::string_trait_t>).m_name);
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"\". In file \"","");
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_230,local_2b0._M_dataplus._M_p,
                   local_2b0._M_dataplus._M_p + local_2b0._M_string_length);
        std::operator+(&local_130,&local_150,&local_230);
        std::operator+(&local_110,&local_130,&info->m_file_name);
        local_1b0 = local_1a0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"\" on line ","");
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_290,local_1b0,local_1b0 + local_1a8);
        std::operator+(&local_f0,&local_110,&local_290);
        string_trait_t::to_string_abi_cxx11_(&local_b0,(string_trait_t *)info->m_line_number,pos);
        std::operator+(&local_d0,&local_f0,&local_b0);
        local_1d0 = local_1c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,".","");
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_170,local_1d0,local_1d0 + local_1c8);
        std::operator+(&local_90,&local_d0,&local_170);
        exception_t<cfgfile::string_trait_t>::exception_t(peVar5,&local_90);
        __cxa_throw(peVar5,&exception_t<cfgfile::string_trait_t>::typeinfo,
                    exception_t<cfgfile::string_trait_t>::~exception_t);
      }
    }
    puVar6 = puVar6 + 1;
  } while( true );
}

Assistant:

void on_finish( const parser_info_t< Trait > & info ) override
	{
		if( !this->is_defined_member_value() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Undefined value of tag: \"" ) +
				this->name() + Trait::from_ascii( "\". In file \"" ) +
				info.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );

		if( m_constraint )
		{
			if( !m_constraint->check( m_value ) )
				throw exception_t< Trait >(
					Trait::from_ascii( "Invalid value: \"" ) +
					m_value +
					Trait::from_ascii( "\". Value must match to the "
						"constraint in tag \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}

		for( const tag_t< Trait > * tag : this->children() )
		{
			if( tag->is_mandatory() && !tag->is_defined() )
				throw exception_t< Trait >(
					Trait::from_ascii( "Undefined child mandatory tag: \"" ) +
					tag->name() +
					Trait::from_ascii( "\". Where parent is: \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}
	}